

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uraid.c
# Opt level: O3

int device_before_raid(void)

{
  sigset_t signals;
  sigset_t sStack_88;
  
  int_block();
  sigemptyset(&sStack_88);
  sigaddset(&sStack_88,0x1d);
  sigprocmask(1,&sStack_88,(sigset_t *)0x0);
  (*currentdsp->cleardisplay)(currentdsp);
  (*(currentdsp->device).before_raid)(currentdsp);
  return 0;
}

Assistant:

int device_before_raid(void) {
#ifdef XWINDOW
  sigset_t signals;
#endif

  int_block();

#ifdef XWINDOW
  /* So X events still get recognized. */
  sigemptyset(&signals);
#ifndef MAIKO_OS_HAIKU
  sigaddset(&signals, SIGIO);
#endif
  sigprocmask(SIG_UNBLOCK, &signals, NULL);
#endif


#ifdef MAIKO_ENABLE_ETHERNET
#ifdef ETHERINT
  if (ether_fd > 0) /* check ether is used or not */
    int_io_close(ether_fd);
#endif
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef RS232INT
  int_io_close(RS232C_Fd);
#endif


#if defined(XWINDOW) || defined(DOS)
  (currentdsp->cleardisplay)(currentdsp);
  (currentdsp->device.before_raid)(currentdsp);
#ifdef DOS
  (currentmouse->device.before_raid)(currentmouse);
  (currentkbd->device.before_raid)(currentkbd);
#endif /* DOS */
#endif /* XWINDOW || DOS */

  return (0);
}